

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O3

OPJ_BOOL opj_j2k_read_header_procedure
                   (opj_j2k_t *p_j2k,opj_stream_private_t *p_stream,opj_event_mgr_t *p_manager)

{
  OPJ_UINT32 OVar1;
  opj_codestream_index_t *poVar2;
  opj_dec_memory_marker_handler_t *poVar3;
  OPJ_BOOL OVar4;
  int iVar5;
  OPJ_SIZE_T OVar6;
  OPJ_OFF_T OVar7;
  OPJ_BYTE *p_buffer;
  opj_dec_memory_marker_handler_t *e;
  opj_dec_memory_marker_handler_t *poVar8;
  char *pcVar9;
  int iVar10;
  long lVar11;
  OPJ_UINT32 OVar12;
  OPJ_UINT32 l_current_marker;
  OPJ_UINT32 l_marker_size;
  OPJ_UINT32 local_48;
  uint local_44;
  int local_40;
  int local_3c;
  int local_38;
  uint local_34;
  
  if (p_stream == (opj_stream_private_t *)0x0) {
    __assert_fail("p_stream != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jpambrun[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x1c0f,
                  "OPJ_BOOL opj_j2k_read_header_procedure(opj_j2k_t *, opj_stream_private_t *, opj_event_mgr_t *)"
                 );
  }
  if (p_j2k == (opj_j2k_t *)0x0) {
    __assert_fail("p_j2k != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jpambrun[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x1c10,
                  "OPJ_BOOL opj_j2k_read_header_procedure(opj_j2k_t *, opj_stream_private_t *, opj_event_mgr_t *)"
                 );
  }
  if (p_manager == (opj_event_mgr_t *)0x0) {
    __assert_fail("p_manager != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jpambrun[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x1c11,
                  "OPJ_BOOL opj_j2k_read_header_procedure(opj_j2k_t *, opj_stream_private_t *, opj_event_mgr_t *)"
                 );
  }
  (p_j2k->m_specific_param).m_decoder.m_state = 1;
  OVar6 = opj_stream_read_data(p_stream,(OPJ_BYTE *)&local_48,2,p_manager);
  if ((OVar6 == 2) && (opj_read_bytes_LE((OPJ_BYTE *)&local_48,&local_34,2), local_34 == 0xff4f)) {
    (p_j2k->m_specific_param).m_decoder.m_state = 2;
    OVar7 = opj_stream_tell(p_stream);
    p_j2k->cstr_index->main_head_start = OVar7 + -2;
    opj_event_msg(p_manager,4,"Start to read j2k main header (%d).\n");
    OVar4 = opj_j2k_add_mhmarker(p_j2k->cstr_index,0xff4f,p_j2k->cstr_index->main_head_start,2);
    if (OVar4 != 0) {
      OVar6 = opj_stream_read_data
                        (p_stream,(p_j2k->m_specific_param).m_decoder.m_header_data,2,p_manager);
      if (OVar6 != 2) {
LAB_001105c8:
        pcVar9 = "Stream too short\n";
        goto LAB_00110314;
      }
      opj_read_bytes_LE((p_j2k->m_specific_param).m_decoder.m_header_data,&local_48,2);
      if (local_48 != 0xff90) {
        iVar10 = 0;
        local_3c = 0;
        iVar5 = 0;
LAB_00110340:
        if (local_48 < 0xff00) {
          opj_event_msg(p_manager,1,"A marker ID was expected (0xff--) instead of %.8x\n");
          return 0;
        }
        lVar11 = 0x137a50;
        do {
          OVar12 = *(OPJ_UINT32 *)(lVar11 + 0x10);
          lVar11 = lVar11 + 0x10;
          if (OVar12 == 0) break;
        } while (OVar12 != local_48);
        local_40 = iVar5;
        local_38 = iVar10;
        if (OVar12 == 0) {
          opj_event_msg(p_manager,2,"Unknown marker\n");
          OVar6 = opj_stream_read_data
                            (p_stream,(p_j2k->m_specific_param).m_decoder.m_header_data,2,p_manager)
          ;
          if (OVar6 == 2) {
            OVar12 = 2;
            do {
              opj_read_bytes_LE((p_j2k->m_specific_param).m_decoder.m_header_data,&local_34,2);
              if (0xfeff < local_34) {
                poVar3 = j2k_memory_marker_handler_tab;
                do {
                  poVar8 = poVar3;
                  OVar1 = poVar8->id;
                  if (OVar1 == 0) break;
                  poVar3 = poVar8 + 1;
                } while (OVar1 != local_34);
                if (((p_j2k->m_specific_param).m_decoder.m_state & poVar8->states) == 0) {
                  pcVar9 = "Marker is not compliant with its position\n";
                  goto LAB_001105e4;
                }
                if (OVar1 != 0) goto LAB_00110568;
                OVar12 = OVar12 + 2;
              }
              OVar6 = opj_stream_read_data
                                (p_stream,(p_j2k->m_specific_param).m_decoder.m_header_data,2,
                                 p_manager);
              if (OVar6 != 2) break;
            } while( true );
          }
          pcVar9 = "Stream too short\n";
          goto LAB_001105e4;
        }
        goto LAB_00110373;
      }
      goto LAB_001102ec;
    }
    opj_event_msg(p_manager,1,"Not enough memory to add mh marker\n");
  }
  pcVar9 = "Expected a SOC marker \n";
LAB_00110314:
  opj_event_msg(p_manager,1,pcVar9);
  return 0;
LAB_00110568:
  if (OVar1 == 0xff90) {
    local_48 = 0xff90;
    iVar10 = local_38;
    goto LAB_00110610;
  }
  poVar2 = p_j2k->cstr_index;
  OVar7 = opj_stream_tell(p_stream);
  OVar4 = opj_j2k_add_mhmarker(poVar2,0,(ulong)((int)OVar7 - OVar12),OVar12);
  if (OVar4 == 0) {
    pcVar9 = "Not enough memory to add mh marker\n";
LAB_001105e4:
    opj_event_msg(p_manager,1,pcVar9);
    pcVar9 = "Unknow marker have been detected and generated error.\n";
    goto LAB_00110314;
  }
  lVar11 = 0x137a50;
  do {
    OVar12 = *(OPJ_UINT32 *)(lVar11 + 0x10);
    lVar11 = lVar11 + 0x10;
    local_48 = OVar1;
    if (OVar12 == 0) break;
  } while (OVar12 != OVar1);
LAB_00110373:
  if (OVar12 == 0xff51) {
    local_3c = 1;
  }
  if (OVar12 == 0xff52) {
    local_40 = 1;
  }
  iVar10 = local_38;
  if (OVar12 == 0xff5c) {
    iVar10 = 1;
  }
  if (((p_j2k->m_specific_param).m_decoder.m_state & *(uint *)(lVar11 + 4)) == 0) {
    pcVar9 = "Marker is not compliant with its position\n";
    goto LAB_00110314;
  }
  OVar6 = opj_stream_read_data
                    (p_stream,(p_j2k->m_specific_param).m_decoder.m_header_data,2,p_manager);
  if (OVar6 != 2) goto LAB_001105c8;
  opj_read_bytes_LE((p_j2k->m_specific_param).m_decoder.m_header_data,&local_44,2);
  local_44 = local_44 - 2;
  p_buffer = (p_j2k->m_specific_param).m_decoder.m_header_data;
  if ((p_j2k->m_specific_param).m_decoder.m_header_data_size < local_44) {
    p_buffer = (OPJ_BYTE *)opj_realloc(p_buffer,(ulong)local_44);
    if (p_buffer == (OPJ_BYTE *)0x0) {
      opj_free((p_j2k->m_specific_param).m_decoder.m_header_data);
      (p_j2k->m_specific_param).m_decoder.m_header_data = (OPJ_BYTE *)0x0;
      (p_j2k->m_specific_param).m_decoder.m_header_data_size = 0;
      pcVar9 = "Not enough memory to read header\n";
      goto LAB_00110314;
    }
    (p_j2k->m_specific_param).m_decoder.m_header_data = p_buffer;
    (p_j2k->m_specific_param).m_decoder.m_header_data_size = local_44;
  }
  OVar6 = opj_stream_read_data(p_stream,p_buffer,(ulong)local_44,p_manager);
  if (OVar6 != local_44) goto LAB_001105c8;
  iVar5 = (**(code **)(lVar11 + 8))
                    (p_j2k,(p_j2k->m_specific_param).m_decoder.m_header_data,(ulong)local_44,
                     p_manager);
  if (iVar5 == 0) {
    pcVar9 = "Marker handler function failed to read the marker segment\n";
    goto LAB_00110314;
  }
  poVar2 = p_j2k->cstr_index;
  OVar7 = opj_stream_tell(p_stream);
  OVar4 = opj_j2k_add_mhmarker(poVar2,OVar12,(ulong)(((int)OVar7 - local_44) - 4),local_44 + 4);
  if (OVar4 == 0) {
    pcVar9 = "Not enough memory to add mh marker\n";
    goto LAB_00110314;
  }
  OVar6 = opj_stream_read_data
                    (p_stream,(p_j2k->m_specific_param).m_decoder.m_header_data,2,p_manager);
  if (OVar6 != 2) goto LAB_001105c8;
  opj_read_bytes_LE((p_j2k->m_specific_param).m_decoder.m_header_data,&local_48,2);
  iVar5 = local_40;
  if (local_48 == 0xff90) goto LAB_00110610;
  goto LAB_00110340;
LAB_00110610:
  if (local_3c != 0) {
    if (local_40 == 0) {
      pcVar9 = "required COD marker not found in main header\n";
    }
    else if (iVar10 == 0) {
      pcVar9 = "required QCD marker not found in main header\n";
    }
    else {
      OVar4 = opj_j2k_merge_ppm(&p_j2k->m_cp,p_manager);
      if (OVar4 != 0) {
        opj_event_msg(p_manager,4,"Main header has been correctly decoded.\n");
        OVar7 = opj_stream_tell(p_stream);
        p_j2k->cstr_index->main_head_end = (ulong)((int)OVar7 - 2);
        (p_j2k->m_specific_param).m_decoder.m_state = 8;
        return 1;
      }
      pcVar9 = "Failed to merge PPM data\n";
    }
    goto LAB_00110314;
  }
LAB_001102ec:
  pcVar9 = "required SIZ marker not found in main header\n";
  goto LAB_00110314;
}

Assistant:

static OPJ_BOOL opj_j2k_read_header_procedure( opj_j2k_t *p_j2k,
                                                                            opj_stream_private_t *p_stream,
                                                                            opj_event_mgr_t * p_manager)
{
        OPJ_UINT32 l_current_marker;
        OPJ_UINT32 l_marker_size;
        const opj_dec_memory_marker_handler_t * l_marker_handler = 00;
        OPJ_BOOL l_has_siz = 0;
        OPJ_BOOL l_has_cod = 0;
        OPJ_BOOL l_has_qcd = 0;

        /* preconditions */
        assert(p_stream != 00);
        assert(p_j2k != 00);
        assert(p_manager != 00);

        /*  We enter in the main header */
        p_j2k->m_specific_param.m_decoder.m_state = J2K_STATE_MHSOC;

        /* Try to read the SOC marker, the codestream must begin with SOC marker */
        if (! opj_j2k_read_soc(p_j2k,p_stream,p_manager)) {
                opj_event_msg(p_manager, EVT_ERROR, "Expected a SOC marker \n");
                return OPJ_FALSE;
        }

        /* Try to read 2 bytes (the next marker ID) from stream and copy them into the buffer */
        if (opj_stream_read_data(p_stream,p_j2k->m_specific_param.m_decoder.m_header_data,2,p_manager) != 2) {
                opj_event_msg(p_manager, EVT_ERROR, "Stream too short\n");
                return OPJ_FALSE;
        }

        /* Read 2 bytes as the new marker ID */
        opj_read_bytes(p_j2k->m_specific_param.m_decoder.m_header_data,&l_current_marker,2);

        /* Try to read until the SOT is detected */
        while (l_current_marker != J2K_MS_SOT) {

                /* Check if the current marker ID is valid */
                if (l_current_marker < 0xff00) {
                        opj_event_msg(p_manager, EVT_ERROR, "A marker ID was expected (0xff--) instead of %.8x\n", l_current_marker);
                        return OPJ_FALSE;
                }

                /* Get the marker handler from the marker ID */
                l_marker_handler = opj_j2k_get_marker_handler(l_current_marker);

                /* Manage case where marker is unknown */
                if (l_marker_handler->id == J2K_MS_UNK) {
                        if (! opj_j2k_read_unk(p_j2k, p_stream, &l_current_marker, p_manager)){
                                opj_event_msg(p_manager, EVT_ERROR, "Unknow marker have been detected and generated error.\n");
                                return OPJ_FALSE;
                        }

                        if (l_current_marker == J2K_MS_SOT)
                                break; /* SOT marker is detected main header is completely read */
                        else    /* Get the marker handler from the marker ID */
                                l_marker_handler = opj_j2k_get_marker_handler(l_current_marker);
                }

                if (l_marker_handler->id == J2K_MS_SIZ) {
                    /* Mark required SIZ marker as found */
                    l_has_siz = 1;
                }
                if (l_marker_handler->id == J2K_MS_COD) {
                    /* Mark required COD marker as found */
                    l_has_cod = 1;
                }
                if (l_marker_handler->id == J2K_MS_QCD) {
                    /* Mark required QCD marker as found */
                    l_has_qcd = 1;
                }

                /* Check if the marker is known and if it is the right place to find it */
                if (! (p_j2k->m_specific_param.m_decoder.m_state & l_marker_handler->states) ) {
                        opj_event_msg(p_manager, EVT_ERROR, "Marker is not compliant with its position\n");
                        return OPJ_FALSE;
                }

                /* Try to read 2 bytes (the marker size) from stream and copy them into the buffer */
                if (opj_stream_read_data(p_stream,p_j2k->m_specific_param.m_decoder.m_header_data,2,p_manager) != 2) {
                        opj_event_msg(p_manager, EVT_ERROR, "Stream too short\n");
                        return OPJ_FALSE;
                }

                /* read 2 bytes as the marker size */
                opj_read_bytes(p_j2k->m_specific_param.m_decoder.m_header_data,&l_marker_size,2);
                l_marker_size -= 2; /* Subtract the size of the marker ID already read */

                /* Check if the marker size is compatible with the header data size */
                if (l_marker_size > p_j2k->m_specific_param.m_decoder.m_header_data_size) {
                        OPJ_BYTE *new_header_data = (OPJ_BYTE *) opj_realloc(p_j2k->m_specific_param.m_decoder.m_header_data, l_marker_size);
                        if (! new_header_data) {
                                opj_free(p_j2k->m_specific_param.m_decoder.m_header_data);
                                p_j2k->m_specific_param.m_decoder.m_header_data = NULL;
                                p_j2k->m_specific_param.m_decoder.m_header_data_size = 0;
                                opj_event_msg(p_manager, EVT_ERROR, "Not enough memory to read header\n");
                                return OPJ_FALSE;
                        }
                        p_j2k->m_specific_param.m_decoder.m_header_data = new_header_data;
                        p_j2k->m_specific_param.m_decoder.m_header_data_size = l_marker_size;
                }

                /* Try to read the rest of the marker segment from stream and copy them into the buffer */
                if (opj_stream_read_data(p_stream,p_j2k->m_specific_param.m_decoder.m_header_data,l_marker_size,p_manager) != l_marker_size) {
                        opj_event_msg(p_manager, EVT_ERROR, "Stream too short\n");
                        return OPJ_FALSE;
                }

                /* Read the marker segment with the correct marker handler */
                if (! (*(l_marker_handler->handler))(p_j2k,p_j2k->m_specific_param.m_decoder.m_header_data,l_marker_size,p_manager)) {
                        opj_event_msg(p_manager, EVT_ERROR, "Marker handler function failed to read the marker segment\n");
                        return OPJ_FALSE;
                }

                /* Add the marker to the codestream index*/
                if (OPJ_FALSE == opj_j2k_add_mhmarker(
                                        p_j2k->cstr_index,
                                        l_marker_handler->id,
                                        (OPJ_UINT32) opj_stream_tell(p_stream) - l_marker_size - 4,
                                        l_marker_size + 4 )) {
                        opj_event_msg(p_manager, EVT_ERROR, "Not enough memory to add mh marker\n");
                        return OPJ_FALSE;
                }

                /* Try to read 2 bytes (the next marker ID) from stream and copy them into the buffer */
                if (opj_stream_read_data(p_stream,p_j2k->m_specific_param.m_decoder.m_header_data,2,p_manager) != 2) {
                        opj_event_msg(p_manager, EVT_ERROR, "Stream too short\n");
                        return OPJ_FALSE;
                }

                /* read 2 bytes as the new marker ID */
                opj_read_bytes(p_j2k->m_specific_param.m_decoder.m_header_data,&l_current_marker,2);
        }

        if (l_has_siz == 0) {
            opj_event_msg(p_manager, EVT_ERROR, "required SIZ marker not found in main header\n");
            return OPJ_FALSE;
        }
        if (l_has_cod == 0) {
            opj_event_msg(p_manager, EVT_ERROR, "required COD marker not found in main header\n");
            return OPJ_FALSE;
        }
        if (l_has_qcd == 0) {
            opj_event_msg(p_manager, EVT_ERROR, "required QCD marker not found in main header\n");
            return OPJ_FALSE;
        }
	
        if (! opj_j2k_merge_ppm(&(p_j2k->m_cp), p_manager)) {
            opj_event_msg(p_manager, EVT_ERROR, "Failed to merge PPM data\n");
            return OPJ_FALSE;
        }

        opj_event_msg(p_manager, EVT_INFO, "Main header has been correctly decoded.\n");

        /* Position of the last element if the main header */
        p_j2k->cstr_index->main_head_end = (OPJ_UINT32) opj_stream_tell(p_stream) - 2;

        /* Next step: read a tile-part header */
        p_j2k->m_specific_param.m_decoder.m_state = J2K_STATE_TPHSOT;

        return OPJ_TRUE;
}